

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O2

wostream * Centaurus::printc(wostream *os,char ch)

{
  int iVar1;
  wchar_t wVar2;
  wostream *pwVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  wchar_t *pwVar5;
  wchar_t buf [16];
  
  uVar4 = CONCAT71(in_register_00000031,ch) & 0xffffffff;
  iVar1 = isgraph((int)CONCAT71(in_register_00000031,ch));
  if (iVar1 == 0) {
    swprintf(buf,0x10,L"\\\\x%0X",uVar4);
    pwVar3 = std::operator<<(os,buf);
    return pwVar3;
  }
  if ((char)uVar4 == '\\') {
    pwVar5 = L"\\\\";
  }
  else {
    if (ch != '\"') {
      wVar2 = std::wios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
      pwVar3 = std::operator<<(os,wVar2);
      return pwVar3;
    }
    pwVar5 = L"\\\"";
  }
  pwVar3 = std::operator<<(os,pwVar5);
  return pwVar3;
}

Assistant:

static std::wostream& printc(std::wostream& os, char ch)
{
	if (!isgraph(ch))
	{
		wchar_t buf[16];
		swprintf(buf, 16, L"\\\\x%0X", (int)ch);
		return os << buf;
	}
	else
	{
		switch (ch)
		{
		case '"':
			return os << L"\\\"";
		case '\\':
			return os << L"\\\\";
		default:
			return os << os.widen(ch);
		}
	}
}